

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.h
# Opt level: O2

void * calloc(size_t __nmemb,size_t __size)

{
  void *pvVar1;
  
  if (s_useDLMalloc != '\0') {
    pvVar1 = cookmem::
             MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
             callocate(&s_memCtx.
                        super_MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                        .m_pool,__nmemb,__size);
    return pvVar1;
  }
  pvVar1 = dlcalloc(__nmemb,__size);
  return pvVar1;
}

Assistant:

void*
calloc (std::size_t num, std::size_t size)
{
    if (s_useDLMalloc)
    {
        return dlcalloc(num, size);
    }
    else
    {
        return s_memCtx.callocate(num, size);
    }
}